

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O2

void __thiscall icu_63::number::impl::DecNum::DecNum(DecNum *this,DecNum *other,UErrorCode *status)

{
  int32_t iVar1;
  decNumber *pdVar2;
  int32_t iVar3;
  rounding rVar4;
  rounding rVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint8_t uVar8;
  undefined3 uVar9;
  undefined2 uVar10;
  decNumber *pdVar11;
  
  pdVar11 = &(this->fData).stackHeader;
  (this->fData).ptr = pdVar11;
  (this->fData).capacity = 0x22;
  (this->fData).needToRelease = '\0';
  iVar1 = (other->fContext).emax;
  iVar3 = (other->fContext).emin;
  rVar4 = (other->fContext).round;
  rVar5 = (other->fContext).round;
  uVar6 = (other->fContext).traps;
  uVar7 = (other->fContext).status;
  uVar8 = (other->fContext).clamp;
  uVar9 = *(undefined3 *)&(other->fContext).field_0x19;
  (this->fContext).digits = (other->fContext).digits;
  (this->fContext).emax = iVar1;
  (this->fContext).emin = iVar3;
  (this->fContext).round = rVar4;
  (this->fContext).round = rVar5;
  (this->fContext).traps = uVar6;
  (this->fContext).status = uVar7;
  (this->fContext).clamp = uVar8;
  *(undefined3 *)&(this->fContext).field_0x19 = uVar9;
  iVar1 = (this->fContext).digits;
  if (0x22 < iVar1) {
    pdVar11 = MaybeStackHeaderAndArray<decNumber,_char,_34>::resize(&this->fData,iVar1,0);
    if (pdVar11 == (decNumber *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    pdVar11 = (this->fData).ptr;
  }
  pdVar2 = (other->fData).ptr;
  uVar8 = pdVar2->lsu[0];
  uVar10 = *(undefined2 *)&pdVar2->field_0xa;
  pdVar11->bits = pdVar2->bits;
  pdVar11->lsu[0] = uVar8;
  *(undefined2 *)&pdVar11->field_0xa = uVar10;
  iVar1 = pdVar2->exponent;
  pdVar11->digits = pdVar2->digits;
  pdVar11->exponent = iVar1;
  memcpy((this->fData).ptr + 1,(other->fData).ptr + 1,(long)(other->fData).capacity);
  return;
}

Assistant:

DecNum::DecNum(const DecNum& other, UErrorCode& status)
        : fContext(other.fContext) {
    // Allocate memory for the new DecNum.
    U_ASSERT(fContext.digits == other.fData.getCapacity());
    if (fContext.digits > kDefaultDigits) {
        void* p = fData.resize(fContext.digits, 0);
        if (p == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // Copy the data from the old DecNum to the new one.
    uprv_memcpy(fData.getAlias(), other.fData.getAlias(), sizeof(decNumber));
    uprv_memcpy(fData.getArrayStart(),
            other.fData.getArrayStart(),
            other.fData.getArrayLimit() - other.fData.getArrayStart());
}